

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_table_scan.cpp
# Opt level: O0

OperatorPartitionData * __thiscall
duckdb::PhysicalTableScan::GetPartitionData
          (PhysicalTableScan *this,ExecutionContext *context,DataChunk *chunk,
          GlobalSourceState *gstate_p,LocalSourceState *lstate,OperatorPartitionInfo *partition_info
          )

{
  pointer ptr_p;
  pointer ptr_p_00;
  pointer ptr_p_01;
  undefined8 *in_RDX;
  GlobalSourceState *in_RSI;
  OperatorPartitionData *in_RDI;
  OperatorPartitionInfo *in_stack_00000008;
  TableFunctionGetPartitionInput input;
  TableScanLocalSourceState *state;
  TableScanGlobalSourceState *gstate;
  optional_ptr<duckdb::GlobalTableFunctionState,_true> local_78;
  optional_ptr<duckdb::LocalTableFunctionState,_true> local_70;
  optional_ptr<const_duckdb::FunctionData,_true> local_68;
  TableFunctionGetPartitionInput local_60;
  TableScanLocalSourceState *local_40;
  TableScanGlobalSourceState *local_38;
  undefined8 *local_18;
  
  local_18 = in_RDX;
  local_38 = GlobalSourceState::Cast<duckdb::TableScanGlobalSourceState>(in_RSI);
  local_40 = LocalSourceState::Cast<duckdb::TableScanLocalSourceState>((LocalSourceState *)in_RSI);
  ptr_p = ::std::unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>::get
                    ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> *
                     )in_RSI);
  optional_ptr<const_duckdb::FunctionData,_true>::optional_ptr(&local_68,ptr_p);
  ptr_p_00 = ::std::
             unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
             ::get((unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
                    *)in_RSI);
  optional_ptr<duckdb::LocalTableFunctionState,_true>::optional_ptr(&local_70,ptr_p_00);
  ptr_p_01 = ::std::
             unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             ::get((unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
                    *)in_RSI);
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::optional_ptr(&local_78,ptr_p_01);
  TableFunctionGetPartitionInput::TableFunctionGetPartitionInput
            (&local_60,local_68,local_70,local_78,in_stack_00000008);
  (*(code *)in_RSI[5].super_StateWithBlockableTasks.blocked_tasks.
            super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
            super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
            _M_impl.super__Vector_impl_data._M_start)(in_RDI,*local_18,&local_60);
  return in_RDI;
}

Assistant:

OperatorPartitionData PhysicalTableScan::GetPartitionData(ExecutionContext &context, DataChunk &chunk,
                                                          GlobalSourceState &gstate_p, LocalSourceState &lstate,
                                                          const OperatorPartitionInfo &partition_info) const {
	D_ASSERT(SupportsPartitioning(partition_info));
	D_ASSERT(function.get_partition_data);
	auto &gstate = gstate_p.Cast<TableScanGlobalSourceState>();
	auto &state = lstate.Cast<TableScanLocalSourceState>();
	TableFunctionGetPartitionInput input(bind_data.get(), state.local_state.get(), gstate.global_state.get(),
	                                     partition_info);
	return function.get_partition_data(context.client, input);
}